

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * pugi::impl::anon_unknown_0::
         strconv_pcdata_impl<pugi::impl::(anonymous_namespace)::opt_false,_pugi::impl::(anonymous_namespace)::opt_false,_pugi::impl::(anonymous_namespace)::opt_false>
         ::parse(char_t *s)

{
  char_t *pcVar1;
  byte *in_RDI;
  char_t *end_1;
  char_t *end;
  char_t ss;
  char_t *begin;
  gap g;
  char_t *in_stack_ffffffffffffffc0;
  gap *in_stack_ffffffffffffffc8;
  gap local_20;
  byte *local_10;
  
  local_10 = in_RDI;
  gap::gap(&local_20);
  do {
    while (((anonymous_namespace)::chartype_table[*local_10] & 1) != 0) {
LAB_001ed7fd:
      if (*local_10 == 0x3c) {
        pcVar1 = gap::flush(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
        *pcVar1 = '\0';
        return (char_t *)(local_10 + 1);
      }
      if (*local_10 == 0) {
        pcVar1 = gap::flush(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
        *pcVar1 = '\0';
        return (char_t *)local_10;
      }
      local_10 = local_10 + 1;
    }
    if (((anonymous_namespace)::chartype_table[local_10[1]] & 1) != 0) {
      local_10 = local_10 + 1;
      goto LAB_001ed7fd;
    }
    if (((anonymous_namespace)::chartype_table[local_10[2]] & 1) != 0) {
      local_10 = local_10 + 2;
      goto LAB_001ed7fd;
    }
    if (((anonymous_namespace)::chartype_table[local_10[3]] & 1) != 0) {
      local_10 = local_10 + 3;
      goto LAB_001ed7fd;
    }
    local_10 = local_10 + 4;
  } while( true );
}

Assistant:

static char_t* parse(char_t* s)
		{
			gap g;

			char_t* begin = s;

			while (true)
			{
				PUGI_IMPL_SCANWHILE_UNROLL(!PUGI_IMPL_IS_CHARTYPE(ss, ct_parse_pcdata));

				if (*s == '<') // PCDATA ends here
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI_IMPL_IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s + 1;
				}
				else if (opt_eol::value && *s == '\r') // Either a single 0x0d or 0x0d 0x0a pair
				{
					*s++ = '\n'; // replace first one with 0x0a

					if (*s == '\n') g.push(s, 1);
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (*s == 0)
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI_IMPL_IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s;
				}
				else ++s;
			}
		}